

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cell.cpp
# Opt level: O1

unique_ptr<Cell,_std::default_delete<Cell>_> __thiscall
CellGenerator::operator()(CellGenerator *this)

{
  int iVar1;
  undefined8 *puVar2;
  runtime_error *this_00;
  uint *in_RSI;
  
  iVar1 = (*in_RSI & 2) + (*in_RSI * 2 & 2);
  if (iVar1 == 0) {
    puVar2 = (undefined8 *)operator_new(0x10);
    *puVar2 = 0;
    puVar2[1] = 0;
    *puVar2 = &PTR__Cell_00121c00;
    puVar2[1] = 0;
  }
  else {
    if (iVar1 != 2) {
      this_00 = (runtime_error *)__cxa_allocate_exception();
      std::runtime_error::runtime_error(this_00,"Runtime Error: Unknown cell type.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    puVar2 = (undefined8 *)operator_new(0x10);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[1] = 0;
    *puVar2 = &PTR__Cell_00121c50;
  }
  this->opt = (int64_t)puVar2;
  return (__uniq_ptr_data<Cell,_std::default_delete<Cell>,_true,_true>)
         (__uniq_ptr_data<Cell,_std::default_delete<Cell>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Cell> CellGenerator::operator()() const {
    using namespace wtlgo::bf;
    uint8_t ver = (opt & NON_WRAPPING_CELLS) * 2 + (opt & SIGNED_CELLS);
    switch (ver) {
        case true  * 2 + true : return std::make_unique<NonWrappingSignedCell>();
        case false * 2 + true : return std::make_unique<SignedCell>();
        case true  * 2 + false: return std::make_unique<NonWrappingCell>();
        case false * 2 + false: return std::make_unique<Cell>();

        default: throw std::runtime_error("Runtime Error: Unknown cell type.");
    }

    return nullptr;
}